

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MmapReader.h
# Opt level: O0

void __thiscall MmapReader::file_helper::~file_helper(file_helper *this)

{
  __off_t __length;
  undefined1 local_50 [8];
  FileReader w;
  file_helper *this_local;
  
  w._56_8_ = this;
  if ((this->trunc & 1U) != 0) {
    FileReader::FileReader((FileReader *)local_50,this);
    FileReader::truncate((FileReader *)local_50,(char *)this->tsize,__length);
    FileReader::~FileReader((FileReader *)local_50);
  }
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

~file_helper()
        {
            if (trunc) {
                FileReader w(fname, FileReader::readwrite);
                w.truncate(tsize);
            }
        }